

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_to_lower_bound.hpp
# Opt level: O3

void burst::
     skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,char,std::less<void>>
               (undefined8 *range)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar4 = (char *)*range;
  pcVar2 = (char *)range[1];
  pcVar3 = pcVar4;
  if (pcVar4 != pcVar2) {
    do {
      pcVar4 = pcVar3 + 1;
      if (pcVar4 == pcVar2) goto LAB_00207826;
      cVar1 = *pcVar3;
      pcVar3 = pcVar4;
    } while (cVar1 <= *pcVar4);
  }
  if (pcVar4 != pcVar2) {
    __assert_fail("boost::algorithm::is_sorted(range, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/range/skip_to_lower_bound.hpp"
                  ,0x18,
                  "void burst::skip_to_lower_bound(Range &, const Value &, Compare) [Range = boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>, Value = char, Compare = std::less<void>]"
                 );
  }
LAB_00207826:
  detail::
  skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,char,std::less<void>>
            ();
  return;
}

Assistant:

void skip_to_lower_bound (Range & range, const Value & goal, Compare compare)
    {
        BOOST_ASSERT(boost::algorithm::is_sorted(range, compare));
        detail::skip_to_lower_bound(range, goal, compare);
    }